

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

void Curl_flush_cookies(Curl_easy *data,_Bool cleanup)

{
  CookieInfo *cookies;
  curl_slist *list;
  bool bVar1;
  uint uVar2;
  CURLcode error;
  int iVar3;
  void *__base;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  Cookie *pCVar8;
  undefined7 in_register_00000031;
  ulong uVar9;
  byte *filename;
  char cVar10;
  undefined8 unaff_R15;
  size_t __nmemb;
  FILE *out;
  FILE *local_50;
  char *local_48;
  uint local_40;
  undefined4 local_3c;
  byte *local_38;
  
  if ((data->set).str[5] == (char *)0x0) {
    if ((cleanup) && (list = (data->state).cookielist, list != (curl_slist *)0x0)) {
      curl_slist_free_all(list);
      (data->state).cookielist = (curl_slist *)0x0;
    }
    Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
    goto LAB_005b9112;
  }
  if ((data->state).cookielist != (curl_slist *)0x0) {
    Curl_cookie_loadfiles(data);
  }
  Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
  cookies = data->cookies;
  filename = (byte *)(data->set).str[5];
  local_50 = (FILE *)0x0;
  local_48 = (char *)0x0;
  if (cookies == (CookieInfo *)0x0) goto LAB_005b9112;
  remove_expired(cookies);
  uVar2 = *filename - 0x2d;
  if (uVar2 == 0) {
    uVar2 = (uint)filename[1];
  }
  if (uVar2 == 0) {
    local_50 = _stdout;
    uVar5 = CONCAT71((int7)((ulong)unaff_R15 >> 8),1);
LAB_005b8f5a:
    fputs("# Netscape HTTP Cookie File\n# https://curl.se/docs/http-cookies.html\n# This file was generated by libcurl! Edit at your own risk.\n\n"
          ,local_50);
    if (cookies->numcookies != 0) {
      __base = (*Curl_ccalloc)(1,cookies->numcookies << 3);
      if (__base == (void *)0x0) {
LAB_005b90b7:
        cVar10 = (char)uVar5;
        error = CURLE_OUT_OF_MEMORY;
        goto LAB_005b90bd;
      }
      local_40 = (uint)uVar5;
      lVar4 = 0;
      __nmemb = 0;
      do {
        for (pCVar8 = cookies->cookies[lVar4]; pCVar8 != (Cookie *)0x0; pCVar8 = pCVar8->next) {
          if (pCVar8->domain != (char *)0x0) {
            *(Cookie **)((long)__base + __nmemb * 8) = pCVar8;
            __nmemb = __nmemb + 1;
          }
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x100);
      local_3c = (undefined4)CONCAT71(in_register_00000031,cleanup);
      local_38 = filename;
      qsort(__base,__nmemb,8,cookie_sort_ct);
      if (__nmemb != 0) {
        uVar5 = 0;
        uVar9 = 1;
        do {
          pcVar6 = get_netscape_format(*(Cookie **)((long)__base + uVar5 * 8));
          if (pcVar6 == (char *)0x0) {
            (*Curl_cfree)(__base);
            cleanup = SUB41(local_3c,0);
            uVar5 = (ulong)local_40;
            goto LAB_005b90b7;
          }
          curl_mfprintf((FILE *)local_50,"%s\n",pcVar6);
          (*Curl_cfree)(pcVar6);
          bVar1 = uVar9 < __nmemb;
          uVar5 = uVar9;
          uVar9 = (ulong)((int)uVar9 + 1);
        } while (bVar1);
      }
      (*Curl_cfree)(__base);
      cleanup = SUB41(local_3c,0);
      uVar5 = (ulong)local_40;
      filename = local_38;
    }
    pcVar6 = local_48;
    if ((char)uVar5 == '\0') {
      fclose(local_50);
      local_50 = (FILE *)0x0;
      if (local_48 == (char *)0x0) {
        pcVar6 = (char *)0x0;
      }
      else {
        iVar3 = Curl_rename(local_48,(char *)filename);
        pcVar6 = local_48;
        if (iVar3 != 0) {
          unlink(local_48);
          error = CURLE_WRITE_ERROR;
          cVar10 = '\0';
          goto LAB_005b90bd;
        }
      }
    }
    (*Curl_cfree)(pcVar6);
  }
  else {
    error = Curl_fopen(data,(char *)filename,(FILE **)&local_50,&local_48);
    if (error == CURLE_OK) {
      uVar5 = 0;
      goto LAB_005b8f5a;
    }
    cVar10 = '\0';
LAB_005b90bd:
    if ((local_50 != (FILE *)0x0) && (cVar10 == '\0')) {
      fclose(local_50);
    }
    (*Curl_cfree)(local_48);
    pcVar6 = (data->set).str[5];
    pcVar7 = curl_easy_strerror(error);
    Curl_infof(data,"WARNING: failed to save cookies in %s: %s",pcVar6,pcVar7);
  }
LAB_005b9112:
  if (cleanup != false) {
    if ((data->share == (Curl_share *)0x0) || (data->cookies != data->share->cookies)) {
      Curl_cookie_cleanup(data->cookies);
      data->cookies = (CookieInfo *)0x0;
    }
  }
  Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
  return;
}

Assistant:

void Curl_flush_cookies(struct Curl_easy *data, bool cleanup)
{
  CURLcode res;

  if(data->set.str[STRING_COOKIEJAR]) {
    if(data->state.cookielist) {
      /* If there is a list of cookie files to read, do it first so that
         we have all the told files read before we write the new jar.
         Curl_cookie_loadfiles() LOCKS and UNLOCKS the share itself! */
      Curl_cookie_loadfiles(data);
    }

    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);

    /* if we have a destination file for all the cookies to get dumped to */
    res = cookie_output(data, data->cookies, data->set.str[STRING_COOKIEJAR]);
    if(res)
      infof(data, "WARNING: failed to save cookies in %s: %s",
            data->set.str[STRING_COOKIEJAR], curl_easy_strerror(res));
  }
  else {
    if(cleanup && data->state.cookielist) {
      /* since nothing is written, we can just free the list of cookie file
         names */
      curl_slist_free_all(data->state.cookielist); /* clean up list */
      data->state.cookielist = NULL;
    }
    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
  }

  if(cleanup && (!data->share || (data->cookies != data->share->cookies))) {
    Curl_cookie_cleanup(data->cookies);
    data->cookies = NULL;
  }
  Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
}